

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcparam.c
# Opt level: O2

void jpeg_simple_progression(j_compress_ptr cinfo)

{
  int iVar1;
  int ncomps;
  jpeg_error_mgr *pjVar2;
  ulong uVar3;
  jpeg_scan_info *pjVar4;
  uint uVar5;
  
  iVar1 = cinfo->global_state;
  ncomps = cinfo->num_components;
  if (iVar1 != 100) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x15;
    (pjVar2->msg_parm).i[0] = iVar1;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  if (ncomps == 3) {
    uVar5 = 10;
    if (cinfo->jpeg_color_space == JCS_YCbCr) goto LAB_0010e085;
  }
  else if (4 < ncomps) {
    uVar5 = ncomps * 6;
    goto LAB_0010e085;
  }
  uVar5 = ncomps * 4 + 2;
LAB_0010e085:
  pjVar4 = cinfo->script_space;
  if ((pjVar4 == (jpeg_scan_info *)0x0) || (cinfo->script_space_size < (int)uVar5)) {
    uVar3 = 10;
    if (10 < (int)uVar5) {
      uVar3 = (ulong)uVar5;
    }
    cinfo->script_space_size = (int)uVar3;
    pjVar4 = (jpeg_scan_info *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,0,uVar3 * 0x24);
    cinfo->script_space = pjVar4;
  }
  cinfo->scan_info = pjVar4;
  cinfo->num_scans = uVar5;
  if ((ncomps == 3) && (cinfo->jpeg_color_space == JCS_YCbCr)) {
    pjVar4 = fill_dc_scans(pjVar4,3,0,1);
    pjVar4->comps_in_scan = 1;
    pjVar4->component_index[0] = 0;
    pjVar4->Ss = 1;
    pjVar4->Se = 5;
    pjVar4->Ah = 0;
    pjVar4->Al = 2;
    pjVar4[1].comps_in_scan = 1;
    pjVar4[1].component_index[0] = 2;
    pjVar4[1].Ss = 1;
    pjVar4[1].Se = 0x3f;
    pjVar4[1].Ah = 0;
    pjVar4[1].Al = 1;
    pjVar4[2].comps_in_scan = 1;
    pjVar4[2].component_index[0] = 1;
    pjVar4[2].Ss = 1;
    pjVar4[2].Se = 0x3f;
    pjVar4[2].Ah = 0;
    pjVar4[2].Al = 1;
    pjVar4[3].comps_in_scan = 1;
    pjVar4[3].component_index[0] = 0;
    pjVar4[3].Ss = 6;
    pjVar4[3].Se = 0x3f;
    pjVar4[3].Ah = 0;
    pjVar4[3].Al = 2;
    pjVar4[4].comps_in_scan = 1;
    pjVar4[4].component_index[0] = 0;
    pjVar4[4].Ss = 1;
    pjVar4[4].Se = 0x3f;
    pjVar4[4].Ah = 2;
    pjVar4[4].Al = 1;
    pjVar4 = fill_dc_scans(pjVar4 + 5,3,1,0);
    pjVar4->comps_in_scan = 1;
    pjVar4->component_index[0] = 2;
    pjVar4->Ss = 1;
    pjVar4->Se = 0x3f;
    pjVar4->Ah = 1;
    pjVar4->Al = 0;
    pjVar4[1].comps_in_scan = 1;
    pjVar4[1].component_index[0] = 1;
    pjVar4[1].Ss = 1;
    pjVar4[1].Se = 0x3f;
    pjVar4[1].Ah = 1;
    pjVar4[1].Al = 0;
    pjVar4[2].comps_in_scan = 1;
    pjVar4[2].component_index[0] = 0;
    pjVar4[2].Ss = 1;
    pjVar4[2].Se = 0x3f;
    pjVar4[2].Ah = 1;
    pjVar4[2].Al = 0;
    return;
  }
  pjVar4 = fill_dc_scans(pjVar4,ncomps,0,1);
  pjVar4 = fill_scans(pjVar4,ncomps,1,5,0,2);
  pjVar4 = fill_scans(pjVar4,ncomps,6,0x3f,0,2);
  pjVar4 = fill_scans(pjVar4,ncomps,1,0x3f,2,1);
  pjVar4 = fill_dc_scans(pjVar4,ncomps,1,0);
  fill_scans(pjVar4,ncomps,1,0x3f,1,0);
  return;
}

Assistant:

GLOBAL(void)
jpeg_simple_progression (j_compress_ptr cinfo)
{
  int ncomps = cinfo->num_components;
  int nscans;
  jpeg_scan_info * scanptr;

  /* Safety check to ensure start_compress not called yet. */
  if (cinfo->global_state != CSTATE_START)
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);

  /* Figure space needed for script.  Calculation must match code below! */
  if (ncomps == 3 && cinfo->jpeg_color_space == JCS_YCbCr) {
    /* Custom script for YCbCr color images. */
    nscans = 10;
  } else {
    /* All-purpose script for other color spaces. */
    if (ncomps > MAX_COMPS_IN_SCAN)
      nscans = 6 * ncomps;	/* 2 DC + 4 AC scans per component */
    else
      nscans = 2 + 4 * ncomps;	/* 2 DC scans; 4 AC scans per component */
  }

  /* Allocate space for script.
   * We need to put it in the permanent pool in case the application performs
   * multiple compressions without changing the settings.  To avoid a memory
   * leak if jpeg_simple_progression is called repeatedly for the same JPEG
   * object, we try to re-use previously allocated space, and we allocate
   * enough space to handle YCbCr even if initially asked for grayscale.
   */
  if (cinfo->script_space == NULL || cinfo->script_space_size < nscans) {
    cinfo->script_space_size = MAX(nscans, 10);
    cinfo->script_space = (jpeg_scan_info *)
      (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_PERMANENT,
			cinfo->script_space_size * SIZEOF(jpeg_scan_info));
  }
  scanptr = cinfo->script_space;
  cinfo->scan_info = scanptr;
  cinfo->num_scans = nscans;

  if (ncomps == 3 && cinfo->jpeg_color_space == JCS_YCbCr) {
    /* Custom script for YCbCr color images. */
    /* Initial DC scan */
    scanptr = fill_dc_scans(scanptr, ncomps, 0, 1);
    /* Initial AC scan: get some luma data out in a hurry */
    scanptr = fill_a_scan(scanptr, 0, 1, 5, 0, 2);
    /* Chroma data is too small to be worth expending many scans on */
    scanptr = fill_a_scan(scanptr, 2, 1, 63, 0, 1);
    scanptr = fill_a_scan(scanptr, 1, 1, 63, 0, 1);
    /* Complete spectral selection for luma AC */
    scanptr = fill_a_scan(scanptr, 0, 6, 63, 0, 2);
    /* Refine next bit of luma AC */
    scanptr = fill_a_scan(scanptr, 0, 1, 63, 2, 1);
    /* Finish DC successive approximation */
    scanptr = fill_dc_scans(scanptr, ncomps, 1, 0);
    /* Finish AC successive approximation */
    scanptr = fill_a_scan(scanptr, 2, 1, 63, 1, 0);
    scanptr = fill_a_scan(scanptr, 1, 1, 63, 1, 0);
    /* Luma bottom bit comes last since it's usually largest scan */
    scanptr = fill_a_scan(scanptr, 0, 1, 63, 1, 0);
  } else {
    /* All-purpose script for other color spaces. */
    /* Successive approximation first pass */
    scanptr = fill_dc_scans(scanptr, ncomps, 0, 1);
    scanptr = fill_scans(scanptr, ncomps, 1, 5, 0, 2);
    scanptr = fill_scans(scanptr, ncomps, 6, 63, 0, 2);
    /* Successive approximation second pass */
    scanptr = fill_scans(scanptr, ncomps, 1, 63, 2, 1);
    /* Successive approximation final pass */
    scanptr = fill_dc_scans(scanptr, ncomps, 1, 0);
    scanptr = fill_scans(scanptr, ncomps, 1, 63, 1, 0);
  }
}